

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O2

void __thiscall FListMenuItem::DrawSelector(FListMenuItem *this,int xofs,int yofs,FTextureID tex)

{
  DFrameBuffer *this_00;
  FTexture *img;
  
  this_00 = screen;
  if (tex.texnum != 0) {
    img = FTextureManager::operator()(&TexMan,tex,false);
    DCanvas::DrawTexture
              ((DCanvas *)this_00,img,(double)(xofs + this->mXpos),(double)(yofs + this->mYpos),
               0x40001390,1,0);
    return;
  }
  if (DMenu::MenuTime % 8 < 6) {
    DCanvas::DrawText((DCanvas *)screen,ConFont,OptionSettings.mFontColorSelection,
                      (xofs + this->mXpos + -0xa0) * CleanXfac +
                      (screen->super_DSimpleCanvas).super_DCanvas.Width / 2,
                      (this->mYpos + yofs + -100) * CleanYfac +
                      (screen->super_DSimpleCanvas).super_DCanvas.Height / 2,"\r",0x400013b8,
                      CleanXfac << 3,0x400013b9,CleanYfac << 3,0);
  }
  return;
}

Assistant:

void FListMenuItem::DrawSelector(int xofs, int yofs, FTextureID tex)
{
	if (tex.isNull())
	{
		if ((DMenu::MenuTime%8) < 6)
		{
			screen->DrawText(ConFont, OptionSettings.mFontColorSelection,
				(mXpos + xofs - 160) * CleanXfac + screen->GetWidth() / 2,
				(mYpos + yofs - 100) * CleanYfac + screen->GetHeight() / 2,
				"\xd",
				DTA_CellX, 8 * CleanXfac,
				DTA_CellY, 8 * CleanYfac,
				TAG_DONE);
		}
	}
	else
	{
		screen->DrawTexture (TexMan(tex), mXpos + xofs, mYpos + yofs, DTA_Clean, true, TAG_DONE);
	}
}